

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void anon_unknown.dwarf_d603ce::clipBezier<((anonymous_namespace)::Edge)2>
               (QPointF *a,QPointF *b,QPointF *c,QPointF *d,qreal t,QPainterPath *result)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  QBezier *in_RCX;
  QPointF *in_R8;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  QPointF QVar7;
  qreal intersection;
  int i;
  qreal lastIntersection;
  int segmentCount;
  int stationary;
  int outCount;
  bool outD;
  bool outC;
  bool outB;
  bool outA;
  qreal t1;
  qreal t0;
  QBezier flipped;
  QBezier unflipped;
  QBezier bezier;
  QPointF points [4];
  qreal segments [4];
  QTransform flip;
  qreal in_stack_fffffffffffffd38;
  QPointF *in_stack_fffffffffffffd40;
  QPointF *in_stack_fffffffffffffd48;
  QBezier *this;
  QBezier *in_stack_fffffffffffffd50;
  QBezier *bezier_00;
  QPointF *in_stack_fffffffffffffd58;
  QBezier *this_00;
  QPointF *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  QTransform *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int iVar8;
  undefined4 in_stack_fffffffffffffd7c;
  qreal in_stack_fffffffffffffdd0;
  qreal in_stack_fffffffffffffdd8;
  qreal local_1c8;
  qreal local_1c0;
  qreal local_1b8;
  qreal local_1b0;
  qreal local_1a8;
  qreal local_1a0;
  qreal local_198;
  qreal local_190;
  undefined1 local_178 [64];
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  QBezier local_b8;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_f8,0xff,0x40);
  QBezier::fromPoints(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                      (QPointF *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  bVar1 = compare<((anonymous_namespace)::Edge)2>
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  bVar2 = compare<((anonymous_namespace)::Edge)2>
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  bVar3 = compare<((anonymous_namespace)::Edge)2>
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  uVar4 = compare<((anonymous_namespace)::Edge)2>
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  iVar6 = (uint)(bVar1 & 1) + (uint)(bVar2 & 1) + (uint)(bVar3 & 1) + (uint)(byte)uVar4;
  if (iVar6 != 4) {
    if (iVar6 == 0) {
      addBezier((QPainterPath *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    }
    else {
      memcpy(local_78 + 0x20,&DAT_00bc1530,0x50);
      bVar5 = isVertical(Right);
      if (bVar5) {
        QTransform::QTransform((QTransform *)(local_78 + 0x20),0.0,1.0,1.0,0.0,0.0,0.0);
      }
      else {
        QTransform::QTransform((QTransform *)in_stack_fffffffffffffd40);
      }
      memset(local_138,0xff,0x40);
      memcpy(local_138,local_f8,0x40);
      memset(local_178,0xff,0x40);
      QBezier::mapBy((QBezier *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd70);
      iVar6 = QBezier::stationaryYPoints
                        ((QBezier *)
                         CONCAT17(bVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(uVar4,iVar6)))),
                         (qreal *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (qreal *)in_stack_fffffffffffffd70);
      local_78._0_8_ = -NAN;
      local_78._8_8_ = -NAN;
      local_78._16_8_ = -NAN;
      local_78._24_8_ = -NAN;
      memset(&local_b8,0xff,0x40);
      bezier_00 = (QBezier *)local_78;
      this_00 = &local_b8;
      do {
        this = this_00;
        QPointF::QPointF((QPointF *)this);
        this_00 = (QBezier *)&this->x2;
      } while (this_00 != bezier_00);
      QVar7 = QBezier::pt1(this);
      local_198 = QVar7.xp;
      local_b8.x1 = local_198;
      local_190 = QVar7.yp;
      local_b8.y1 = local_190;
      local_78._0_8_ = 0.0;
      iVar8 = 0;
      if (0 < iVar6) {
        iVar8 = 1;
        local_78._8_8_ = 0.0;
        QVar7 = QBezier::pointAt(in_RCX,in_XMM0_Qa);
        local_1a8 = QVar7.xp;
        *(qreal *)(local_78 + (long)iVar8 * 0x10 + -0x40) = local_1a8;
        local_1a0 = QVar7.yp;
        *(qreal *)(local_78 + (long)iVar8 * 0x10 + -0x38) = local_1a0;
      }
      if (1 < iVar6) {
        iVar8 = iVar8 + 1;
        *(undefined8 *)(local_78 + (long)iVar8 * 8) = 0x3ff0000000000000;
        QVar7 = QBezier::pointAt(in_RCX,in_XMM0_Qa);
        local_1b8 = QVar7.xp;
        *(qreal *)(local_78 + (long)iVar8 * 0x10 + -0x40) = local_1b8;
        local_1b0 = QVar7.yp;
        *(qreal *)(local_78 + (long)iVar8 * 0x10 + -0x38) = local_1b0;
      }
      iVar8 = iVar8 + 1;
      *(undefined8 *)(local_78 + (long)iVar8 * 8) = 0x3ff0000000000000;
      QVar7 = QBezier::pt4(this);
      local_1c8 = QVar7.xp;
      *(qreal *)(local_78 + (long)iVar8 * 0x10 + -0x40) = local_1c8;
      local_1c0 = QVar7.yp;
      *(qreal *)(local_78 + (long)iVar8 * 0x10 + -0x38) = local_1c0;
      for (iVar6 = 0; iVar6 < iVar8; iVar6 = iVar6 + 1) {
        bVar1 = compare<((anonymous_namespace)::Edge)2>
                          (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        bVar2 = compare<((anonymous_namespace)::Edge)2>
                          (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        if (((bVar1 & 1) != bVar2) &&
           (in_stack_fffffffffffffd60 =
                 (QPointF *)
                 QBezier::tForY((QBezier *)CONCAT44(iVar6,in_stack_fffffffffffffd68),
                                in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                                (qreal)in_stack_fffffffffffffd60), (bVar2 & 1) != 0)) {
          in_stack_fffffffffffffd40 = in_R8;
          QBezier::getSubRange(this_00,(qreal)bezier_00,(qreal)this);
          addBezier((QPainterPath *)this_00,bezier_00);
        }
      }
      if ((bVar2 & 1) == 0) {
        QBezier::getSubRange(this_00,(qreal)bezier_00,(qreal)this);
        addBezier((QPainterPath *)this_00,bezier_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clipBezier(const QPointF &a, const QPointF &b, const QPointF &c, const QPointF &d, qreal t, QPainterPath &result)
{
    QBezier bezier = QBezier::fromPoints(a, b, c, d);

    bool outA = compare<edge>(a, t);
    bool outB = compare<edge>(b, t);
    bool outC = compare<edge>(c, t);
    bool outD = compare<edge>(d, t);

    int outCount = int(outA) + int(outB) + int(outC) + int(outD);

    if (outCount == 4)
        return;

    if (outCount == 0) {
        addBezier(result, bezier);
        return;
    }

    QTransform flip = isVertical(edge) ? QTransform(0, 1, 1, 0, 0, 0) : QTransform();
    QBezier unflipped = bezier;
    QBezier flipped = bezier.mapBy(flip);

    qreal t0 = 0, t1 = 1;
    int stationary = flipped.stationaryYPoints(t0, t1);

    qreal segments[4];
    QPointF points[4];
    points[0] = unflipped.pt1();
    segments[0] = 0;

    int segmentCount = 0;
    if (stationary > 0) {
        ++segmentCount;
        segments[segmentCount] = t0;
        points[segmentCount] = unflipped.pointAt(t0);
    }
    if (stationary > 1) {
        ++segmentCount;
        segments[segmentCount] = t1;
        points[segmentCount] = unflipped.pointAt(t1);
    }
    ++segmentCount;
    segments[segmentCount] = 1;
    points[segmentCount] = unflipped.pt4();

    qreal lastIntersection = 0;
    for (int i = 0; i < segmentCount; ++i) {
        outA = compare<edge>(points[i], t);
        outB = compare<edge>(points[i+1], t);

        if (outA != outB) {
            qreal intersection = flipped.tForY(segments[i], segments[i+1], t);

            if (outB)
                addBezier(result, unflipped.getSubRange(lastIntersection, intersection));

            lastIntersection = intersection;
        }
    }

    if (!outB)
        addBezier(result, unflipped.getSubRange(lastIntersection, 1));
}